

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_calculate_cc_base(tcv_t *tcv)

{
  uint local_20;
  int local_1c;
  int sum;
  int i;
  tcv_t *tcv_local;
  
  local_20 = 0;
  if ((tcv == (tcv_t *)0x0) || (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = 0xfffffffc;
  }
  else {
    for (local_1c = 0; local_1c < 0x3f; local_1c = local_1c + 1) {
      local_20 = *(byte *)((long)tcv->data + (long)local_1c + 1) + local_20;
    }
    tcv_local._4_4_ = local_20 & 0xff;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_calculate_cc_base(tcv_t *tcv)
{
	int i;
	int sum = 0;

	if (tcv == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* The CC Base is the low order 8 bits of the sum of the contents of all
	 * bytes from 0x00 to 0x62 */
	for (i = FIRST_CC_BASE_ADDR; i <= LAST_CC_BASE_ADDR; i++)
		sum += ((sfp_data_t*)tcv->data)->a0[i];

	/* Return low order 8 bits only */
	return (sum & 0xff);
}